

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipcm.c
# Opt level: O3

void multipcm_alloc_rom(void *info,UINT32 memsize)

{
  uint uVar1;
  void *__s;
  MultiPCM *ptChip;
  
  if (*(UINT32 *)((long)info + 0x22cc) != memsize) {
    __s = realloc(*(void **)((long)info + 0x22d0),(ulong)memsize);
    *(void **)((long)info + 0x22d0) = __s;
    *(UINT32 *)((long)info + 0x22cc) = memsize;
    memset(__s,0xff,(ulong)memsize);
    if (memsize == 0) {
      uVar1 = 0;
    }
    else {
      uVar1 = memsize - 1 >> 1 | memsize - 1;
      uVar1 = uVar1 >> 2 | uVar1;
      uVar1 = uVar1 >> 4 | uVar1;
      uVar1 = uVar1 >> 8 | uVar1;
      uVar1 = uVar1 >> 0x10 | uVar1;
    }
    *(uint *)((long)info + 0x22c8) = uVar1;
  }
  return;
}

Assistant:

static void multipcm_alloc_rom(void* info, UINT32 memsize)
{
	MultiPCM *ptChip = (MultiPCM *)info;
	
	if (ptChip->ROMSize == memsize)
		return;
	
	ptChip->ROM = (UINT8*)realloc(ptChip->ROM, memsize);
	ptChip->ROMSize = memsize;
	memset(ptChip->ROM, 0xFF, memsize);
	
	ptChip->ROMMask = pow2_mask(memsize);
	
	return;
}